

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::code_coefficients_pass_one(jpeg_encoder *this,int component_num)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  uint32 (*pauVar6) [256];
  int iVar7;
  uint uVar8;
  
  if (component_num < 3) {
    uVar8 = (int)this->m_coefficient_array[0] - this->m_last_dc_val[component_num];
    this->m_last_dc_val[component_num] = (int)this->m_coefficient_array[0];
    uVar2 = -uVar8;
    if (0 < (int)uVar8) {
      uVar2 = uVar8;
    }
    pauVar6 = this->m_huff_count + (component_num != 0);
    for (; uVar2 != 0; uVar2 = uVar2 >> 1) {
      pauVar6 = (uint32 (*) [256])(*pauVar6 + 1);
    }
    (*pauVar6)[0] = (*pauVar6)[0] + 1;
    pauVar6 = this->m_huff_count + (ulong)(component_num != 0) + 2;
    iVar5 = 0;
    for (lVar3 = 1; lVar3 != 0x40; lVar3 = lVar3 + 1) {
      uVar1 = this->m_coefficient_array[lVar3];
      if (uVar1 == 0) {
        iVar5 = iVar5 + 1;
      }
      else {
        iVar7 = iVar5 * 0x10 + 1;
        for (; 0xf < iVar5; iVar5 = iVar5 + -0x10) {
          (*pauVar6)[0xf0] = (*pauVar6)[0xf0] + 1;
          iVar7 = iVar7 + -0x100;
        }
        uVar4 = -uVar1;
        if (0 < (short)uVar1) {
          uVar4 = uVar1;
        }
        for (uVar2 = (uint)uVar4; 1 < uVar2; uVar2 = uVar2 >> 1) {
          iVar7 = iVar7 + 1;
        }
        (*pauVar6)[iVar7] = (*pauVar6)[iVar7] + 1;
        iVar5 = 0;
      }
    }
    if (iVar5 != 0) {
      (*pauVar6)[0] = (*pauVar6)[0] + 1;
    }
  }
  return;
}

Assistant:

void jpeg_encoder::code_coefficients_pass_one(int component_num)
{
  if (component_num >= 3) return; // just to shut up static analysis
  int i, run_len, nbits, temp1;
  int16 *src = m_coefficient_array;
  uint32 *dc_count = component_num ? m_huff_count[0 + 1] : m_huff_count[0 + 0], *ac_count = component_num ? m_huff_count[2 + 1] : m_huff_count[2 + 0];

  temp1 = src[0] - m_last_dc_val[component_num];
  m_last_dc_val[component_num] = src[0];
  if (temp1 < 0) temp1 = -temp1;

  nbits = 0;
  while (temp1)
  {
    nbits++; temp1 >>= 1;
  }

  dc_count[nbits]++;
  for (run_len = 0, i = 1; i < 64; i++)
  {
    if ((temp1 = m_coefficient_array[i]) == 0)
      run_len++;
    else
    {
      while (run_len >= 16)
      {
        ac_count[0xF0]++;
        run_len -= 16;
      }
      if (temp1 < 0) temp1 = -temp1;
      nbits = 1;
      while (temp1 >>= 1) nbits++;
      ac_count[(run_len << 4) + nbits]++;
      run_len = 0;
    }
  }
  if (run_len) ac_count[0]++;
}